

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_iterator_suite.cpp
# Opt level: O0

void distance_suite::test_real(void)

{
  undefined4 local_8c;
  iterator local_88;
  iterator local_60;
  difference_type local_48 [2];
  undefined1 local_38 [8];
  variable data;
  
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>
            ((basic_variable<std::allocator<char>_> *)local_38,0.0);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_60,(basic_variable<std::allocator<char>_> *)local_38);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_88,(basic_variable<std::allocator<char>_> *)local_38);
  local_48[0] = std::distance<trial::dynamic::basic_variable<std::allocator<char>>::iterator>
                          (&local_60,&local_88);
  local_8c = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(data.begin(), data.end())","1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0x8ce,"void distance_suite::test_real()",local_48,&local_8c);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_88);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_60);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_38);
  return;
}

Assistant:

void test_real()
{
    variable data(0.0);
    TRIAL_PROTOCOL_TEST_EQUAL(std::distance(data.begin(), data.end()), 1);
}